

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::StoreBlockSwitch
               (BlockSplitCode *code,size_t block_ix,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  const_reference pvVar3;
  byte *pbVar4;
  const_reference pvVar5;
  size_t lencode;
  size_t typecode;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t block_ix_local;
  BlockSplitCode *code_local;
  
  if (block_ix != 0) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&code->type_code,block_ix);
    uVar2 = *pvVar3;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&code->type_depths,(ulong)uVar2);
    bVar1 = *pbVar4;
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&code->type_bits,(ulong)uVar2);
    WriteBits((ulong)bVar1,(ulong)*pvVar5,storage_ix,storage);
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&code->length_prefix,block_ix);
  uVar2 = *pvVar3;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&code->length_depths,(ulong)uVar2);
  bVar1 = *pbVar4;
  pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&code->length_bits,(ulong)uVar2);
  WriteBits((ulong)bVar1,(ulong)*pvVar5,storage_ix,storage);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&code->length_nextra,block_ix);
  uVar2 = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&code->length_extra,block_ix);
  WriteBits((ulong)uVar2,(ulong)*pvVar3,storage_ix,storage);
  return;
}

Assistant:

void StoreBlockSwitch(const BlockSplitCode& code,
                      const size_t block_ix,
                      size_t* storage_ix,
                      uint8_t* storage) {
  if (block_ix > 0) {
    size_t typecode = code.type_code[block_ix];
    WriteBits(code.type_depths[typecode], code.type_bits[typecode],
              storage_ix, storage);
  }
  size_t lencode = code.length_prefix[block_ix];
  WriteBits(code.length_depths[lencode], code.length_bits[lencode],
            storage_ix, storage);
  WriteBits(code.length_nextra[block_ix], code.length_extra[block_ix],
            storage_ix, storage);
}